

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::TextureCubeView::sample
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  TextureFormat TVar6;
  void *pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int i;
  float s_00;
  int depth;
  int iVar10;
  long lVar11;
  IVec3 *in_RDX;
  long lVar12;
  long lVar13;
  Vector<float,_4> *res_2;
  int iVar14;
  int iVar15;
  CubeFace baseFace;
  Sampler *sampler_00;
  bool *pbVar16;
  float t_00;
  float fVar17;
  float fVar19;
  float fVar20;
  Vec4 VVar21;
  CubeFaceFloatCoords CVar22;
  ConstPixelBufferAccess faceAccesses [6];
  ConstPixelBufferAccess faceAccesses1 [6];
  undefined1 local_248 [16];
  undefined1 local_238 [24];
  TextureFormat local_220;
  undefined1 local_218 [8];
  TextureFormat TStack_210;
  int local_208 [2];
  void *pvStack_200;
  TextureFormat TStack_1f8;
  int iStack_1f0;
  int local_1ec;
  ChannelOrder CStack_1e8;
  int aiStack_1e4 [45];
  undefined8 uStack_130;
  float local_128 [2];
  undefined8 uStack_120;
  undefined8 auStack_118 [29];
  ulong uVar18;
  
  local_218._4_4_ = t;
  local_218._0_4_ = s;
  TStack_210.order = (ChannelOrder)r;
  CVar22 = getCubeFaceCoords((Vec3 *)local_218);
  t_00 = CVar22.t;
  uVar18 = CVar22._0_8_;
  s_00 = CVar22.s;
  if ((char)in_RDX[4].m_data[1] != '\x01') {
    local_218 = (undefined1  [8])0x0;
    TStack_210 = (TextureFormat)((ulong)TStack_210.type << 0x20);
    VVar21 = sampleLevelArray2DOffset
                       ((ConstPixelBufferAccess *)this,
                        (int)*(undefined8 *)(&sampler->wrapR + (uVar18 & 0xffffffff) * 2),
                        (Sampler *)(ulong)sampler->wrapS,s_00,t_00,lod,in_RDX);
    fVar19 = VVar21.m_data[2];
    fVar20 = VVar21.m_data[3];
    uVar18 = VVar21.m_data._0_8_;
    goto LAB_019f12f5;
  }
  fVar19 = (float)in_RDX[1].m_data[2];
  fVar20 = 0.0;
  uVar3 = in_RDX[1].m_data[lod <= fVar19];
  if (5 < uVar3) {
    uVar18 = 0;
    this->m_numLevels = 0;
    *(undefined4 *)&this->field_0x4 = 0;
    this->m_levels[0] = (ConstPixelBufferAccess *)0x0;
    goto LAB_019f12f5;
  }
  pbVar16 = (bool *)&sampler->wrapR;
  depth = (int)in_RDX;
  switch(uVar3) {
  case 0:
    sampler_00 = *(Sampler **)((long)pbVar16 + (uVar18 & 0xffffffff) * 2 * 4);
    TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
    local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
    pvStack_200 = *(void **)in_RDX[2].m_data;
    TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
    aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
    local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 1:
    lVar12 = 8;
    do {
      *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
      *(undefined8 *)(local_218 + lVar12) = 0;
      *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
      *(undefined8 *)((long)local_208 + lVar12) = 0;
      *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
      lVar12 = lVar12 + 0x28;
    } while (lVar12 != 0xf8);
    lVar12 = 0;
    do {
      puVar1 = *(undefined8 **)pbVar16;
      (&TStack_1f8)[lVar12] = *(TextureFormat *)(puVar1 + 4);
      uVar5 = *puVar1;
      TVar6 = *(TextureFormat *)(puVar1 + 1);
      pvVar7 = (void *)puVar1[3];
      *(undefined8 *)(local_208 + lVar12 * 2) = puVar1[2];
      (&pvStack_200)[lVar12] = pvVar7;
      *(undefined8 *)(local_218 + lVar12 * 8) = uVar5;
      (&TStack_210)[lVar12] = TVar6;
      lVar12 = lVar12 + 5;
      pbVar16 = pbVar16 + 8;
    } while (lVar12 != 0x1e);
    baseFace = (CubeFace)local_218;
LAB_019f12f0:
    VVar21 = sampleCubeSeamlessLinear
                       ((ConstPixelBufferAccess (*) [6])this,baseFace,
                        (Sampler *)(uVar18 & 0xffffffff),s_00,t_00,depth);
    fVar19 = VVar21.m_data[2];
    fVar20 = VVar21.m_data[3];
    uVar18 = VVar21.m_data._0_8_;
    goto LAB_019f12f5;
  default:
    iVar14 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar19 = ceilf(lod + 0.5);
    iVar15 = (int)fVar19 + -1;
    if (iVar15 < iVar14) {
      iVar14 = iVar15;
    }
    iVar10 = 0;
    if (-1 < iVar15) {
      iVar10 = iVar14;
    }
    if (uVar3 == 4) {
      lVar12 = 8;
      do {
        *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar12) = 0;
        *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
        *(undefined8 *)((long)local_208 + lVar12) = 0;
        *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar11 = (long)iVar10;
      lVar12 = 0;
      do {
        lVar13 = *(long *)pbVar16;
        (&TStack_1f8)[lVar12] = *(TextureFormat *)(lVar13 + 0x20 + lVar11 * 0x28);
        puVar1 = (undefined8 *)(lVar13 + lVar11 * 0x28);
        uVar5 = *puVar1;
        TVar6 = *(TextureFormat *)(puVar1 + 1);
        puVar1 = (undefined8 *)(lVar13 + 0x10 + lVar11 * 0x28);
        pvVar7 = (void *)puVar1[1];
        *(undefined8 *)(local_208 + lVar12 * 2) = *puVar1;
        (&pvStack_200)[lVar12] = pvVar7;
        *(undefined8 *)(local_218 + lVar12 * 8) = uVar5;
        (&TStack_210)[lVar12] = TVar6;
        lVar12 = lVar12 + 5;
        pbVar16 = pbVar16 + 8;
      } while (lVar12 != 0x1e);
      baseFace = (CubeFace)local_218;
      goto LAB_019f12f0;
    }
    sampler_00 = (Sampler *)
                 ((long)iVar10 * 0x28 + *(long *)((long)pbVar16 + (uVar18 & 0xffffffff) * 2 * 4));
    TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
    local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
    pvStack_200 = *(void **)in_RDX[2].m_data;
    TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
    aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
    CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
    iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
    local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
    break;
  case 3:
  case 5:
    iVar15 = sampler->wrapS - CLAMP_TO_BORDER;
    fVar17 = floorf(lod);
    iVar10 = (int)fVar17;
    iVar14 = iVar15;
    if (iVar10 < iVar15) {
      iVar14 = iVar10;
    }
    if (iVar10 < 0) {
      iVar14 = 0;
    }
    if (iVar14 + 1 <= iVar15) {
      iVar15 = iVar14 + 1;
    }
    local_238._0_4_ = R;
    local_238._4_4_ = SNORM_INT8;
    local_238._8_4_ = 0;
    local_238._12_4_ = 0;
    local_248._0_4_ = R;
    local_248._4_4_ = SNORM_INT8;
    local_248._8_4_ = 0;
    local_248._12_4_ = 0;
    if (uVar3 == 5) {
      lVar12 = 8;
      do {
        *(undefined8 *)(local_218 + lVar12 + -8) = 0x2600000015;
        *(undefined8 *)(local_218 + lVar12) = 0;
        *(undefined8 *)((long)&TStack_210.order + lVar12) = 0;
        *(undefined8 *)((long)local_208 + lVar12) = 0;
        *(undefined8 *)((long)&pvStack_200 + lVar12) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar12 = 8;
      do {
        *(undefined8 *)((long)&uStack_130 + lVar12) = 0x2600000015;
        *(undefined8 *)((long)local_128 + lVar12) = 0;
        *(undefined8 *)((long)auStack_118 + lVar12 + -8) = 0;
        *(undefined8 *)((long)auStack_118 + lVar12) = 0;
        *(undefined8 *)((long)auStack_118 + lVar12 + 8) = 0;
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 0xf8);
      lVar11 = (long)iVar14;
      lVar13 = (long)iVar15;
      lVar12 = 0;
      do {
        lVar4 = *(long *)pbVar16;
        (&TStack_1f8)[lVar12] = *(TextureFormat *)(lVar4 + 0x20 + lVar11 * 0x28);
        puVar1 = (undefined8 *)(lVar4 + lVar11 * 0x28);
        uVar5 = *puVar1;
        TVar6 = *(TextureFormat *)(puVar1 + 1);
        puVar1 = (undefined8 *)(lVar4 + 0x10 + lVar11 * 0x28);
        pvVar7 = (void *)puVar1[1];
        *(undefined8 *)(local_208 + lVar12 * 2) = *puVar1;
        (&pvStack_200)[lVar12] = pvVar7;
        *(undefined8 *)(local_218 + lVar12 * 8) = uVar5;
        (&TStack_210)[lVar12] = TVar6;
        puVar1 = (undefined8 *)(lVar4 + lVar13 * 0x28);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)(lVar4 + 0x10 + lVar13 * 0x28);
        uVar8 = *puVar2;
        uVar9 = puVar2[1];
        *(undefined8 *)(local_128 + lVar12 * 2) = *puVar1;
        auStack_118[lVar12 + -1] = uVar5;
        auStack_118[lVar12] = uVar8;
        auStack_118[lVar12 + 1] = uVar9;
        auStack_118[lVar12 + 2] = *(undefined8 *)(lVar4 + 0x20 + lVar13 * 0x28);
        lVar12 = lVar12 + 5;
        pbVar16 = pbVar16 + 8;
      } while (lVar12 != 0x1e);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_238,(CubeFace)local_218,
                 (Sampler *)(uVar18 & 0xffffffff),s_00,t_00,depth);
      sampleCubeSeamlessLinear
                ((ConstPixelBufferAccess (*) [6])local_248,(CubeFace)local_128,
                 (Sampler *)(uVar18 & 0xffffffff),s_00,t_00,depth);
    }
    else {
      local_220 = (TextureFormat)(uVar18 & 0xffffffff);
      TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
      local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
      pvStack_200 = *(void **)in_RDX[2].m_data;
      TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
      aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
      iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
      local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      local_218 = (undefined1  [8])0x0;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      uStack_120._0_4_ = 0;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_238,
                 (Sampler *)
                 ((long)iVar14 * 0x28 + *(long *)((long)pbVar16 + (long)local_220 * 2 * 4)),
                 (FilterMode)local_218,s_00,t_00,(IVec3 *)0x0);
      TStack_210 = *(TextureFormat *)(in_RDX->m_data + 2);
      local_208 = *(int (*) [2])(in_RDX[1].m_data + 1);
      pvStack_200 = *(void **)in_RDX[2].m_data;
      TStack_1f8 = *(TextureFormat *)(in_RDX[2].m_data + 2);
      aiStack_1e4._0_8_ = *(undefined8 *)(in_RDX[4].m_data + 1);
      CStack_1e8 = (ChannelOrder)((ulong)*(undefined8 *)(in_RDX[3].m_data + 2) >> 0x20);
      iStack_1f0 = (int)*(undefined8 *)(in_RDX[3].m_data + 1);
      local_1ec = (int)((ulong)*(undefined8 *)(in_RDX[3].m_data + 1) >> 0x20);
      local_218 = (undefined1  [8])0x0;
      local_128[0] = 0.0;
      local_128[1] = 0.0;
      uStack_120 = (ulong)uStack_120._4_4_ << 0x20;
      ConstPixelBufferAccess::sample2DOffset
                ((ConstPixelBufferAccess *)local_248,
                 (Sampler *)
                 ((long)iVar15 * 0x28 + *(long *)((long)pbVar16 + (long)local_220 * 2 * 4)),
                 (FilterMode)local_218,s_00,t_00,(IVec3 *)0x0);
    }
    local_218 = (undefined1  [8])0x0;
    TStack_210.order = R;
    TStack_210.type = SNORM_INT8;
    lVar12 = 0;
    do {
      fVar20 = 0.0;
      fVar19 = *(float *)(local_238 + lVar12 * 4) * (1.0 - (lod - fVar17));
      *(float *)(local_218 + lVar12 * 4) = fVar19;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    uStack_120 = 0;
    lVar12 = 0;
    do {
      local_128[lVar12] = *(float *)(local_248 + lVar12 * 4) * (lod - fVar17);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    *(undefined8 *)this = 0;
    this->m_levels[0] = (ConstPixelBufferAccess *)0x0;
    lVar12 = 0;
    do {
      uVar18 = (ulong)(uint)(*(float *)(local_218 + lVar12 * 4) + local_128[lVar12]);
      *(float *)((long)this->m_levels + lVar12 * 4 + -8) =
           *(float *)(local_218 + lVar12 * 4) + local_128[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    goto LAB_019f12f5;
  }
  uStack_120 = (ulong)uStack_120._4_4_ << 0x20;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_218 = (undefined1  [8])0x0;
  VVar21 = ConstPixelBufferAccess::sample2DOffset
                     ((ConstPixelBufferAccess *)this,sampler_00,(FilterMode)local_218,s_00,t_00,
                      (IVec3 *)0x0);
  fVar19 = VVar21.m_data[2];
  fVar20 = VVar21.m_data[3];
  uVar18 = VVar21.m_data._0_8_;
LAB_019f12f5:
  VVar21.m_data[3] = fVar20;
  VVar21.m_data[2] = fVar19;
  VVar21.m_data[0] = (float)(int)uVar18;
  VVar21.m_data[1] = (float)(int)(uVar18 >> 0x20);
  return (Vec4)VVar21.m_data;
}

Assistant:

tcu::Vec4 TextureCubeView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamless(m_levels, m_numLevels, coords.face, sampler, coords.s, coords.t, 0 /* depth */, lod);
	else
		return sampleLevelArray2D(m_levels[coords.face], m_numLevels, sampler, coords.s, coords.t, 0 /* depth */, lod);
}